

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PFBStreamTest.cpp
# Opt level: O0

int PFBStreamTest(int argc,char **argv)

{
  IByteReader *inStreamToDecode;
  IByteWriter *inOutputStream;
  OutputStreamTraits local_168;
  OutputStreamTraits traits;
  string local_158;
  string local_138;
  allocator<char> local_111;
  string local_110;
  string local_f0;
  undefined1 local_d0 [8];
  InputPFBDecodeStream decodeStream;
  undefined1 local_80 [8];
  OutputFile decodedPFBFile;
  InputFile pfbFile;
  EStatusCode status;
  char **argv_local;
  int argc_local;
  
  InputFile::InputFile((InputFile *)&decodedPFBFile.mFileStream);
  OutputFile::OutputFile((OutputFile *)local_80);
  InputPFBDecodeStream::InputPFBDecodeStream((InputPFBDecodeStream *)local_d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"fonts/HLB_____.PFB",&local_111);
  BuildRelativeInputPath(&local_f0,argv,&local_110);
  InputFile::OpenFile((InputFile *)&decodedPFBFile.mFileStream,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"decodedPFBFile.txt",
             (allocator<char> *)((long)&traits.mOutputStream + 7));
  BuildRelativeOutputPath(&local_138,argv,&local_158);
  OutputFile::OpenFile((OutputFile *)local_80,&local_138,false);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)((long)&traits.mOutputStream + 7));
  inStreamToDecode =
       &InputFile::GetInputStream((InputFile *)&decodedPFBFile.mFileStream)->super_IByteReader;
  pfbFile.mFileStream._4_4_ =
       InputPFBDecodeStream::Assign((InputPFBDecodeStream *)local_d0,inStreamToDecode);
  if (pfbFile.mFileStream._4_4_ == eSuccess) {
    inOutputStream = &OutputFile::GetOutputStream((OutputFile *)local_80)->super_IByteWriter;
    OutputStreamTraits::OutputStreamTraits(&local_168,inOutputStream);
    pfbFile.mFileStream._4_4_ =
         OutputStreamTraits::CopyToOutputStream(&local_168,(IByteReader *)local_d0);
    if (pfbFile.mFileStream._4_4_ != eSuccess) {
      std::operator<<((ostream *)&std::cout,"Failed to decode pfb stream");
    }
    OutputStreamTraits::~OutputStreamTraits(&local_168);
  }
  else {
    std::operator<<((ostream *)&std::cout,"Failed to assign pfb input stream");
  }
  InputPFBDecodeStream::Assign((InputPFBDecodeStream *)local_d0,(IByteReader *)0x0);
  InputFile::CloseFile((InputFile *)&decodedPFBFile.mFileStream);
  OutputFile::CloseFile((OutputFile *)local_80);
  InputPFBDecodeStream::~InputPFBDecodeStream((InputPFBDecodeStream *)local_d0);
  OutputFile::~OutputFile((OutputFile *)local_80);
  InputFile::~InputFile((InputFile *)&decodedPFBFile.mFileStream);
  return (uint)(pfbFile.mFileStream._4_4_ != eSuccess);
}

Assistant:

int PFBStreamTest(int argc, char* argv[])
{
	EStatusCode status;
	InputFile pfbFile;
	OutputFile decodedPFBFile;
	InputPFBDecodeStream decodeStream;

	do
	{
		pfbFile.OpenFile(BuildRelativeInputPath(argv,"fonts/HLB_____.PFB"));

		decodedPFBFile.OpenFile(BuildRelativeOutputPath(argv,"decodedPFBFile.txt"));


		status = decodeStream.Assign(pfbFile.GetInputStream());
		
		if(status != PDFHummus::eSuccess)
		{
			cout<<"Failed to assign pfb input stream";
			break;
		}

		OutputStreamTraits traits(decodedPFBFile.GetOutputStream());

		status = traits.CopyToOutputStream(&decodeStream);

		if(status != PDFHummus::eSuccess)
		{
			cout<<"Failed to decode pfb stream";
			break;
		}
	}while(false);

	decodeStream.Assign(NULL);
	pfbFile.CloseFile();
	decodedPFBFile.CloseFile();

	return status == eSuccess ? 0:1;
}